

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::ElementsAreMatcherBase::
Check<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (AssertionResult *__return_storage_ptr__,ElementsAreMatcherBase *this,int *it,int *end,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers)

{
  AssertionResult *pAVar1;
  type **in_R9;
  size_t cnt;
  ulong local_40;
  int local_34;
  AssertionResult local_30;
  
  local_40 = (long)it - (long)this >> 2;
  if (local_40 < 4) {
    local_30.m_message._M_dataplus._M_p = (pointer)&local_30.m_message.field_2;
    local_30.m_message._M_string_length = 0;
    local_30.m_message.field_2._M_local_buf[0] = '\0';
    local_30.m_result = false;
    pAVar1 = AssertionResult::operator<<(&local_30,(char (*) [23])"ElementsAre: argument[");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [16])"] is less than ");
    local_34 = 4;
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_34);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    CheckElem<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
              (__return_storage_ptr__,this,it,end,
               (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
                *)&iutest_type_traits::enabler_t<void>::value,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Check(Ite it, Ite end, M& matchers)
    {
        const size_t cnt = ::std::distance(it, end);
        if IUTEST_COND_UNLIKELY( cnt < LAST+1 )
        {
            return AssertionFailure() << "ElementsAre: argument[" << cnt << "] is less than " << LAST+1;
        }